

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

string * __thiscall
boost::deflate::deflate_stream_test::decompress_abi_cxx11_
          (string *__return_storage_ptr__,deflate_stream_test *this,string_view *in,wrap wrap)

{
  int iVar1;
  logic_error *plVar2;
  z_stream zs;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  zs.adler = 0;
  zs.reserved = 0;
  zs.opaque = (voidpf)0x0;
  zs.data_type = 0;
  zs._92_4_ = 0;
  zs.zalloc = (alloc_func)0x0;
  zs.zfree = (free_func)0x0;
  zs.msg = (char *)0x0;
  zs.state = (internal_state *)0x0;
  zs.avail_out = 0;
  zs._36_4_ = 0;
  zs.total_out = 0;
  zs.total_in = 0;
  zs.next_out = (Bytef *)0x0;
  zs.next_in = (Bytef *)0x0;
  zs.avail_in = 0;
  zs._12_4_ = 0;
  iVar1 = 0xf;
  if ((int)in == 0) {
    iVar1 = -0xf;
  }
  iVar1 = inflateInit2_(&zs,iVar1,"1.2.11",0x70);
  if (iVar1 == 0) {
    zs.next_in = (Bytef *)(this->zlib_compressor).super_ICompressor._vptr_ICompressor;
    zs.avail_in = *(uInt *)&(this->zlib_compressor).zs.next_in;
    do {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      zs.next_out = (Bytef *)((__return_storage_ptr__->_M_dataplus)._M_p + zs.total_out);
      zs.avail_out = (int)__return_storage_ptr__->_M_string_length - (int)zs.total_out;
      iVar1 = inflate(&zs,2);
      if ((iVar1 + 4U < 7) && ((0x43U >> (iVar1 + 4U & 0x1f) & 1) != 0)) {
        plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar2,"inflate failed");
        __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    } while ((zs.avail_out == 0) && (iVar1 != 1));
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    inflateEnd(&zs);
    return __return_storage_ptr__;
  }
  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar2,"inflateInit2 failed");
  __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static
    std::string decompress(string_view const& in, wrap wrap =boost::deflate::wrap::none)
    {
        int result;
        std::string out;
        z_stream zs;
        memset(&zs, 0, sizeof(zs));
        result = inflateInit2(&zs, wrap == boost::deflate::wrap::none ? -15 : 15);
        if(result != Z_OK)
            throw std::logic_error{"inflateInit2 failed"};
        try
        {
            zs.next_in = (Bytef*)in.data();
            zs.avail_in = static_cast<uInt>(in.size());
            for(;;)
            {
                out.resize(zs.total_out + 1024);
                zs.next_out = (Bytef*)&out[zs.total_out];
                zs.avail_out = static_cast<uInt>(
                    out.size() - zs.total_out);
                result = inflate(&zs, Z_SYNC_FLUSH);
                if( result == Z_NEED_DICT ||
                    result == Z_DATA_ERROR ||
                    result == Z_MEM_ERROR)
                {
                    throw std::logic_error("inflate failed");
                }
                if(zs.avail_out > 0)
                    break;
                if(result == Z_STREAM_END)
                    break;
            }
            out.resize(zs.total_out);
            inflateEnd(&zs);
        }
        catch(...)
        {
            inflateEnd(&zs);
            throw;
        }
        return out;
    }